

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

binary_t * __thiscall
nlohmann::json_abi_v3_11_3::
basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
::get_binary(basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
             *this)

{
  type_error *__return_storage_ptr__;
  char **in_RCX;
  char *local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if ((this->m_data).m_type == binary) {
    return (binary_t *)(this->m_data).m_value.object;
  }
  __return_storage_ptr__ = (type_error *)__cxa_allocate_exception(0x20);
  local_40 = type_name(this);
  detail::concat<std::__cxx11::string,char_const(&)[29],char_const*>
            (&local_38,(detail *)"type must be binary, but is ",(char (*) [29])&local_40,in_RCX);
  detail::type_error::
  create<const_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_0>
            (__return_storage_ptr__,0x12e,&local_38,this);
  __cxa_throw(__return_storage_ptr__,&detail::type_error::typeinfo,detail::exception::~exception);
}

Assistant:

const binary_t& get_binary() const
    {
        if (!is_binary())
        {
            JSON_THROW(type_error::create(302, detail::concat("type must be binary, but is ", type_name()), this));
        }

        return *get_ptr<const binary_t*>();
    }